

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFlagsTable.h
# Opt level: O3

void __thiscall
Js::RangeBase<Js::SourceFunctionNode>::Add
          (RangeBase<Js::SourceFunctionNode> *this,SourceFunctionNode i,SourceFunctionNode j,
          RangeBase<Js::SourceFunctionNode> *oppositeRange)

{
  RealCount *pRVar1;
  undefined4 *puVar2;
  NoCheckHeapAllocator *this_00;
  code *pcVar3;
  SListBase<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount> *buffer;
  NodeBase *pNVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  Type pSVar9;
  Type *pTVar10;
  SourceFunctionNode SVar11;
  uint *n;
  char *pcVar12;
  undefined8 *in_FS_OFFSET;
  RangeUnit<Js::SourceFunctionNode> RVar13;
  RangeUnit<Js::SourceFunctionNode> unit;
  RangeUnit<Js::SourceFunctionNode> unit_00;
  RangeUnit<Js::SourceFunctionNode> unit_01;
  undefined1 auStack_88 [8];
  Unit lowUnit;
  Unit topUnit;
  undefined1 local_60 [8];
  EditingIterator it;
  
  pSVar9 = (Type)Memory::NoCheckHeapAllocator::Alloc((this->range).allocator,0x18);
  *(SourceFunctionNode *)(pSVar9 + 1) = i;
  *(SourceFunctionNode *)(pSVar9 + 2) = j;
  n = (uint *)(this->range).
              super_SListBase<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>
              .super_SListNodeBase<Memory::NoCheckHeapAllocator>.next;
  pSVar9->next = (Type)n;
  (this->range).
  super_SListBase<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>.
  super_SListNodeBase<Memory::NoCheckHeapAllocator>.next = pSVar9;
  pRVar1 = &(this->range).
            super_SListBase<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>
            .super_RealCount;
  pRVar1->count = pRVar1->count + 1;
  if (oppositeRange != (RangeBase<Js::SourceFunctionNode> *)0x0) {
    it.super_EditingIterator.last = (NodeBase *)j;
    if ((RangeBase<Js::SourceFunctionNode> *)
        (oppositeRange->range).
        super_SListBase<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>
        .super_SListNodeBase<Memory::NoCheckHeapAllocator>.next == oppositeRange) {
      RVar13 = GetFullRange<Js::SourceFunctionNode>();
      pSVar9 = (Type)Memory::NoCheckHeapAllocator::Alloc((oppositeRange->range).allocator,0x18);
      *(RangeUnit<Js::SourceFunctionNode> *)(pSVar9 + 1) = RVar13;
      n = (uint *)(oppositeRange->range).
                  super_SListBase<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>
                  .super_SListNodeBase<Memory::NoCheckHeapAllocator>.next;
      pSVar9->next = (Type)n;
      (oppositeRange->range).
      super_SListBase<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>
      .super_SListNodeBase<Memory::NoCheckHeapAllocator>.next = pSVar9;
      pRVar1 = &(oppositeRange->range).
                super_SListBase<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>
                .super_RealCount;
      pRVar1->count = pRVar1->count + 1;
    }
    it.super_EditingIterator.super_Iterator.current = (NodeBase *)0x0;
    local_60 = (undefined1  [8])oppositeRange;
    it.super_EditingIterator.super_Iterator.list =
         (SListBase<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>
          *)oppositeRange;
    bVar5 = SListBase<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>
            ::EditingIterator::Next((EditingIterator *)local_60);
    pNVar4 = it.super_EditingIterator.last;
    if (bVar5) {
      puVar2 = (undefined4 *)*in_FS_OFFSET;
      do {
        pTVar10 = SListBase<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>
                  ::Iterator::Data((Iterator *)local_60);
        RVar13.j = i;
        RVar13.i = pTVar10->j;
        bVar5 = RangeUnitContains<Js::SourceFunctionNode>
                          ((Js *)pTVar10->i,RVar13,(SourceFunctionNode)n);
        unit.j = (SourceFunctionNode)pNVar4;
        unit.i = pTVar10->j;
        bVar6 = RangeUnitContains<Js::SourceFunctionNode>
                          ((Js *)pTVar10->i,unit,(SourceFunctionNode)n);
        unit_00.j = pTVar10->i;
        unit_00.i = (SourceFunctionNode)pNVar4;
        bVar7 = RangeUnitContains<Js::SourceFunctionNode>((Js *)i,unit_00,(SourceFunctionNode)n);
        unit_01.j = pTVar10->j;
        unit_01.i = (SourceFunctionNode)pNVar4;
        bVar8 = RangeUnitContains<Js::SourceFunctionNode>((Js *)i,unit_01,(SourceFunctionNode)n);
        n = &switchD_001e5721::switchdataD_002dd804;
        switch(bVar5 + bVar6 * '\x02' + bVar7 * '\x04' + bVar8 * '\b') {
        case '\0':
          break;
        default:
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar2 = 1;
          pcVar12 = "UNREACHED";
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ConfigFlagsTable.h"
                                      ,0x3c4,"((0))","UNREACHED");
          if (!bVar5) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar2 = 0;
          n = (uint *)pcVar12;
          break;
        case '\x03':
          auStack_88 = *(undefined1 (*) [8])&pTVar10->i;
          lowUnit.i = pTVar10->j;
          lowUnit.j = pTVar10->i;
          lowUnit.i = GetPrevious<Js::SourceFunctionNode>(i);
          lowUnit.j = GetNext<Js::SourceFunctionNode>
                                ((SourceFunctionNode)it.super_EditingIterator.last);
          SListBase<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>
          ::EditingIterator::InsertBefore
                    ((EditingIterator *)local_60,
                     (NoCheckHeapAllocator *)
                     (((SListBase<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>
                        *)((long)local_60 + 0x10))->
                     super_SListNodeBase<Memory::NoCheckHeapAllocator>).next,
                     (RangeUnit<Js::SourceFunctionNode> *)auStack_88);
          SListBase<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>
          ::EditingIterator::InsertBefore
                    ((EditingIterator *)local_60,
                     (NoCheckHeapAllocator *)
                     (((SListBase<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>
                        *)((long)local_60 + 0x10))->
                     super_SListNodeBase<Memory::NoCheckHeapAllocator>).next,
                     (RangeUnit<Js::SourceFunctionNode> *)&lowUnit.j);
        case '\f':
        case '\r':
        case '\x0e':
        case '\x0f':
          buffer = it.super_EditingIterator.super_Iterator.list;
          this_00 = (NoCheckHeapAllocator *)
                    (((SListBase<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>
                       *)((long)local_60 + 0x10))->super_SListNodeBase<Memory::NoCheckHeapAllocator>
                    ).next;
          SListBase<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>
          ::EditingIterator::UnlinkCurrentNode((EditingIterator *)local_60);
          Memory::NoCheckHeapAllocator::Free(this_00,buffer,0x18);
          break;
        case '\x06':
        case '\a':
          SVar11 = GetNext<Js::SourceFunctionNode>
                             ((SourceFunctionNode)it.super_EditingIterator.last);
          pTVar10->i = SVar11;
          break;
        case '\t':
        case '\v':
          SVar11 = GetPrevious<Js::SourceFunctionNode>(i);
          pTVar10->j = SVar11;
        }
        bVar5 = SListBase<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>
                ::EditingIterator::Next((EditingIterator *)local_60);
      } while (bVar5);
    }
  }
  return;
}

Assistant:

void
RangeBase<TRangeUnitData>::Add(TRangeUnitData i, TRangeUnitData j, RangeBase<TRangeUnitData>* oppositeRange)
{
    RangeUnit<TRangeUnitData> a(i, j);
    range.Prepend(a);
    if (oppositeRange)
    {
        if (oppositeRange->range.Empty())
        {
            oppositeRange->range.Prepend(GetFullRange<TRangeUnitData>());
        }
        // Do an intersection
        auto it = oppositeRange->range.GetEditingIterator();
        while (it.Next())
        {
            Unit& unit = it.Data();
            bool c1 = RangeUnitContains(unit, i);
            bool c2 = RangeUnitContains(unit, j);
            bool c3 = RangeUnitContains(a, unit.i);
            bool c4 = RangeUnitContains(a, unit.j);
            enum IntersectionCase
            {
                NoIntersection = 0,
                AddedFullyContained = 3, // [ u [a] ]
                IntersectionAdded_Unit = 6, // [ a [ ] u ]
                CommonLowBound_Unit = 7, // [[ a ] u ]
                IntersectionUnit_Added = 9, // [ u [ ] a ]
                CommonTopBound_Unit = 11, // [ u [ a ]]
                UnitFullyContained = 12, // [ a [u] ]
                CommonLowBound_Added = 13, // [[ u ] a ]
                CommonTopBound_Added = 14, // [ a [ u ]]
                FullIntersection = 15 // [[a, u]]
            };
            IntersectionCase intersectionCase = (IntersectionCase)((int)c1 | (c2 << 1) | (c3 << 2) | (c4 << 3));
            switch (intersectionCase)
            {
            case NoIntersection:
                // Nothing to do
                break;
            case AddedFullyContained:
            {
                // Need to break the current in 2
                Unit lowUnit = unit;
                Unit topUnit = unit;
                lowUnit.j = GetPrevious(a.i);
                topUnit.i = GetNext(a.j);
                it.InsertBefore(lowUnit);
                it.InsertBefore(topUnit);
                it.RemoveCurrent();
                break;
            }
            case IntersectionAdded_Unit:
            case CommonLowBound_Unit:
                // Move the unit lower bound after the added upper bound
                unit.i = GetNext(a.j);
                break;
            case IntersectionUnit_Added:
            case CommonTopBound_Unit:
                // Move the unit upper bound before the added lower bound
                unit.j = GetPrevious(a.i);
                break;
            case CommonTopBound_Added:
            case CommonLowBound_Added:
            case UnitFullyContained:
            case FullIntersection:
                // Remove the unit
                it.RemoveCurrent();
                break;
            default:
                Assert(UNREACHED);
                break;
            }
        }
    }
}